

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ODCode128Reader.cpp
# Opt level: O0

Barcode * __thiscall
ZXing::OneD::Code128Reader::decodePattern
          (Code128Reader *this,int rowNumber,PatternView *next,
          unique_ptr<ZXing::OneD::RowReader::DecodingState,_std::default_delete<ZXing::OneD::RowReader::DecodingState>_>
          *param_4)

{
  bool bVar1;
  value_type vVar2;
  int y;
  int iVar3;
  int iVar4;
  byte *pbVar5;
  PatternView *in_RCX;
  uint uVar6;
  Barcode *in_RDI;
  int xStop;
  int i;
  int checksum;
  Error error;
  int code;
  Raw2TxtDecoder raw2txt;
  ByteArray rawCodes;
  int xStart;
  int startCode;
  anon_class_1_0_00000001 decodePattern;
  int minCharCount;
  undefined4 in_stack_fffffffffffffcf8;
  undefined4 in_stack_fffffffffffffcfc;
  Error *in_stack_fffffffffffffd00;
  undefined4 in_stack_fffffffffffffd08;
  float in_stack_fffffffffffffd0c;
  undefined5 in_stack_fffffffffffffd10;
  Type in_stack_fffffffffffffd15;
  undefined1 in_stack_fffffffffffffd16;
  undefined1 in_stack_fffffffffffffd17;
  int in_stack_fffffffffffffd18;
  int in_stack_fffffffffffffd1c;
  undefined4 in_stack_fffffffffffffd20;
  undefined4 in_stack_fffffffffffffd24;
  undefined4 in_stack_fffffffffffffd28;
  undefined4 in_stack_fffffffffffffd2c;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_fffffffffffffd30;
  int in_stack_fffffffffffffd3c;
  undefined4 in_stack_fffffffffffffd40;
  undefined4 in_stack_fffffffffffffd44;
  undefined8 in_stack_fffffffffffffd50;
  undefined4 in_stack_fffffffffffffd58;
  undefined4 in_stack_fffffffffffffd5c;
  undefined8 in_stack_fffffffffffffd70;
  undefined1 readerInit;
  BarcodeFormat in_stack_fffffffffffffd78;
  int in_stack_fffffffffffffd7c;
  int in_stack_fffffffffffffd80;
  string *in_stack_fffffffffffffd88;
  Result *in_stack_fffffffffffffd90;
  SymbologyIdentifier in_stack_fffffffffffffda0;
  Error *in_stack_fffffffffffffda8;
  string local_1c0 [36];
  int local_19c;
  string local_198 [80];
  int local_148;
  uint local_144;
  Iterator local_110;
  undefined8 uStack_108;
  Iterator local_100;
  Iterator puStack_f8;
  uchar local_e9;
  int local_e8 [2];
  Raw2TxtDecoder local_e0;
  uchar local_9d;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_90;
  int local_78;
  int local_74;
  Iterator local_70;
  undefined8 local_68;
  Iterator local_60;
  Iterator local_58;
  Iterator local_50;
  undefined8 local_48;
  Iterator local_40;
  Iterator local_38;
  int local_2c;
  PatternView *local_20;
  
  local_2c = 4;
  local_20 = in_RCX;
  FindLeftGuard<3,4,false>
            ((PatternView *)CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40),
             in_stack_fffffffffffffd3c,(FixedPattern<3,_4,_false> *)in_stack_fffffffffffffd30,
             (double)CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28));
  local_20->_data = local_50;
  *(undefined8 *)&local_20->_size = local_48;
  local_20->_base = local_40;
  local_20->_end = local_38;
  bVar1 = PatternView::isValid((PatternView *)in_stack_fffffffffffffd00);
  if (bVar1) {
    PatternView::subView
              ((PatternView *)CONCAT44(in_stack_fffffffffffffd24,in_stack_fffffffffffffd20),
               in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18);
    local_20->_data = local_70;
    *(undefined8 *)&local_20->_size = local_68;
    local_20->_base = local_60;
    local_20->_end = local_58;
    local_74 = Code128Reader::decodePattern::anon_class_1_0_00000001::operator()
                         ((anon_class_1_0_00000001 *)
                          CONCAT44(in_stack_fffffffffffffd24,in_stack_fffffffffffffd20),
                          (PatternView *)
                          CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18),
                          (bool)in_stack_fffffffffffffd17);
    if ((local_74 < 0x67) || (0x69 < local_74)) {
      memset(in_RDI,0,0xd8);
      Result::Result((Result *)CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40));
    }
    else {
      local_78 = PatternView::pixelsInFront((PatternView *)in_stack_fffffffffffffd00);
      ByteArray::ByteArray((ByteArray *)0x28d0e1);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::reserve
                (in_stack_fffffffffffffd30,
                 CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28));
      local_9d = narrow_cast<unsigned_char,int&>(&local_74);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffd00,
                 (value_type_conflict *)
                 CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
      Raw2TxtDecoder::Raw2TxtDecoder
                ((Raw2TxtDecoder *)CONCAT44(in_stack_fffffffffffffd24,in_stack_fffffffffffffd20),
                 in_stack_fffffffffffffd1c);
LAB_0028d138:
      bVar1 = PatternView::skipSymbol((PatternView *)0x28d147);
      if (bVar1) {
        local_e8[0] = Code128Reader::decodePattern::anon_class_1_0_00000001::operator()
                                ((anon_class_1_0_00000001 *)
                                 CONCAT44(in_stack_fffffffffffffd24,in_stack_fffffffffffffd20),
                                 (PatternView *)
                                 CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18),
                                 (bool)in_stack_fffffffffffffd17);
        if (local_e8[0] == -1) {
          in_RDI->_format = None;
          in_RDI->_ecLevel[0] = '\0';
          in_RDI->_ecLevel[1] = '\0';
          in_RDI->_ecLevel[2] = '\0';
          in_RDI->_ecLevel[3] = '\0';
          in_RDI->_version[0] = '\0';
          in_RDI->_version[1] = '\0';
          in_RDI->_version[2] = '\0';
          in_RDI->_version[3] = '\0';
          in_RDI->_lineCount = 0;
          (in_RDI->_sai).id.field_2._M_allocated_capacity = 0;
          *(undefined8 *)((long)&(in_RDI->_sai).id.field_2 + 8) = 0;
          *(undefined8 *)&(in_RDI->_sai).id = 0;
          (in_RDI->_sai).id._M_string_length = 0;
          *(undefined8 *)&(in_RDI->_readerOpts)._formats = 0;
          (in_RDI->_sai).index = 0;
          (in_RDI->_sai).count = 0;
          (in_RDI->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[3].x = 0;
          (in_RDI->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[3].y = 0;
          *(undefined8 *)&in_RDI->_readerOpts = 0;
          (in_RDI->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[1].x = 0;
          (in_RDI->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[1].y = 0;
          (in_RDI->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[2].x = 0;
          (in_RDI->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[2].y = 0;
          (in_RDI->_error)._line = 0;
          (in_RDI->_error)._type = None;
          *(undefined5 *)&(in_RDI->_error).field_0x2b = 0;
          (in_RDI->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[0].x = 0;
          (in_RDI->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[0].y = 0;
          *(undefined8 *)((long)&(in_RDI->_error)._msg.field_2 + 8) = 0;
          (in_RDI->_error)._file = (char *)0x0;
          (in_RDI->_error)._msg._M_string_length = 0;
          (in_RDI->_error)._msg.field_2._M_allocated_capacity = 0;
          (in_RDI->_content).symbology.code = '\0';
          (in_RDI->_content).symbology.modifier = '\0';
          (in_RDI->_content).symbology.eciModifierOffset = '\0';
          (in_RDI->_content).symbology.aiFlag = None;
          (in_RDI->_content).defaultCharset = Unknown;
          (in_RDI->_content).hasECI = false;
          *(undefined2 *)&(in_RDI->_content).field_0x36 = 0;
          *(undefined8 *)&(in_RDI->_error)._msg = 0;
          (in_RDI->_content).encodings.
          super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          (in_RDI->_content).encodings.
          super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          (in_RDI->_content).bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          (in_RDI->_content).encodings.
          super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          (in_RDI->_content).bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          (in_RDI->_content).bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          in_RDI->_isMirrored = false;
          in_RDI->_isInverted = false;
          in_RDI->_readerInit = false;
          *(undefined5 *)&in_RDI->field_0xd3 = 0;
          Result::Result((Result *)CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40));
          local_e8[1] = 1;
        }
        else if (local_e8[0] == 0x6a) {
          y = Size<ZXing::ByteArray>((ByteArray *)in_stack_fffffffffffffd00);
          if (y < local_2c + -1) {
            in_RDI->_format = None;
            in_RDI->_ecLevel[0] = '\0';
            in_RDI->_ecLevel[1] = '\0';
            in_RDI->_ecLevel[2] = '\0';
            in_RDI->_ecLevel[3] = '\0';
            in_RDI->_version[0] = '\0';
            in_RDI->_version[1] = '\0';
            in_RDI->_version[2] = '\0';
            in_RDI->_version[3] = '\0';
            in_RDI->_lineCount = 0;
            (in_RDI->_sai).id.field_2._M_allocated_capacity = 0;
            *(undefined8 *)((long)&(in_RDI->_sai).id.field_2 + 8) = 0;
            *(undefined8 *)&(in_RDI->_sai).id = 0;
            (in_RDI->_sai).id._M_string_length = 0;
            *(undefined8 *)&(in_RDI->_readerOpts)._formats = 0;
            (in_RDI->_sai).index = 0;
            (in_RDI->_sai).count = 0;
            (in_RDI->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[3].x = 0;
            (in_RDI->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[3].y = 0;
            *(undefined8 *)&in_RDI->_readerOpts = 0;
            (in_RDI->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[1].x = 0;
            (in_RDI->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[1].y = 0;
            (in_RDI->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[2].x = 0;
            (in_RDI->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[2].y = 0;
            (in_RDI->_error)._line = 0;
            (in_RDI->_error)._type = None;
            *(undefined5 *)&(in_RDI->_error).field_0x2b = 0;
            (in_RDI->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[0].x = 0;
            (in_RDI->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[0].y = 0;
            *(undefined8 *)((long)&(in_RDI->_error)._msg.field_2 + 8) = 0;
            (in_RDI->_error)._file = (char *)0x0;
            (in_RDI->_error)._msg._M_string_length = 0;
            (in_RDI->_error)._msg.field_2._M_allocated_capacity = 0;
            (in_RDI->_content).symbology.code = '\0';
            (in_RDI->_content).symbology.modifier = '\0';
            (in_RDI->_content).symbology.eciModifierOffset = '\0';
            (in_RDI->_content).symbology.aiFlag = None;
            (in_RDI->_content).defaultCharset = Unknown;
            (in_RDI->_content).hasECI = false;
            *(undefined2 *)&(in_RDI->_content).field_0x36 = 0;
            *(undefined8 *)&(in_RDI->_error)._msg = 0;
            (in_RDI->_content).encodings.
            super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>.
            _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            (in_RDI->_content).encodings.
            super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            (in_RDI->_content).bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            (in_RDI->_content).encodings.
            super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>.
            _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            (in_RDI->_content).bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            (in_RDI->_content).bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            in_RDI->_isMirrored = false;
            in_RDI->_isInverted = false;
            in_RDI->_readerInit = false;
            *(undefined5 *)&in_RDI->field_0xd3 = 0;
            Result::Result((Result *)CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40));
            local_e8[1] = 1;
          }
          else {
            PatternView::subView
                      ((PatternView *)CONCAT44(in_stack_fffffffffffffd24,in_stack_fffffffffffffd20),
                       in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18);
            local_20->_base = local_100;
            local_20->_end = puStack_f8;
            local_20->_data = local_110;
            *(undefined8 *)&local_20->_size = uStack_108;
            bVar1 = PatternView::isValid((PatternView *)in_stack_fffffffffffffd00);
            if (bVar1) {
              vVar2 = PatternView::operator[](local_20,6);
              uVar6 = (uint)vVar2;
              iVar3 = PatternView::sum((PatternView *)
                                       CONCAT44(in_stack_fffffffffffffd24,in_stack_fffffffffffffd20)
                                       ,in_stack_fffffffffffffd1c);
              if ((iVar3 / 4 < (int)uVar6) ||
                 (bVar1 = PatternView::hasQuietZoneAfter<true>
                                    ((PatternView *)
                                     CONCAT17(in_stack_fffffffffffffd17,
                                              CONCAT16(in_stack_fffffffffffffd16,
                                                       CONCAT15(in_stack_fffffffffffffd15,
                                                                in_stack_fffffffffffffd10))),
                                     in_stack_fffffffffffffd0c), !bVar1)) goto LAB_0028d58b;
              Error::Error(in_stack_fffffffffffffd00);
              pbVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::front
                                 ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                  in_stack_fffffffffffffd00);
              local_144 = (uint)*pbVar5;
              local_148 = 1;
              while( true ) {
                iVar3 = local_148;
                iVar4 = Size<ZXing::ByteArray>((ByteArray *)in_stack_fffffffffffffd00);
                readerInit = (undefined1)((ulong)in_stack_fffffffffffffd70 >> 0x38);
                if (iVar4 + -1 <= iVar3) break;
                iVar3 = local_148;
                pbVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                                   (&local_90,(long)local_148);
                local_144 = iVar3 * (uint)*pbVar5 + local_144;
                local_148 = local_148 + 1;
              }
              uVar6 = (int)local_144 % 0x67;
              pbVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::back
                                 ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                  in_stack_fffffffffffffd00);
              if (uVar6 != *pbVar5) {
                std::__cxx11::string::string(local_198);
                Error::Error((Error *)CONCAT44(in_stack_fffffffffffffd24,in_stack_fffffffffffffd20),
                             (char *)CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18),
                             CONCAT11(in_stack_fffffffffffffd17,in_stack_fffffffffffffd16),
                             in_stack_fffffffffffffd15,
                             (string *)CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08)
                            );
                Error::operator=(in_stack_fffffffffffffd00,
                                 (Error *)CONCAT44(in_stack_fffffffffffffcfc,
                                                   in_stack_fffffffffffffcf8));
                Error::~Error((Error *)0x28d74a);
                std::__cxx11::string::~string(local_198);
              }
              local_19c = PatternView::pixelsTillEnd((PatternView *)in_stack_fffffffffffffd00);
              Raw2TxtDecoder::text_abi_cxx11_
                        ((Raw2TxtDecoder *)
                         CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
              Raw2TxtDecoder::symbologyIdentifier(&local_e0);
              Error::Error(in_stack_fffffffffffffd00,
                           (Error *)CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
              Raw2TxtDecoder::readerInit(&local_e0);
              Result::Result(in_stack_fffffffffffffd90,in_stack_fffffffffffffd88,y,
                             in_stack_fffffffffffffd80,in_stack_fffffffffffffd7c,
                             in_stack_fffffffffffffd78,in_stack_fffffffffffffda0,
                             in_stack_fffffffffffffda8,(bool)readerInit);
              Error::~Error((Error *)0x28d87c);
              std::__cxx11::string::~string(local_1c0);
              local_e8[1] = 1;
              Error::~Error((Error *)0x28d8a1);
            }
            else {
LAB_0028d58b:
              in_RDI->_format = None;
              in_RDI->_ecLevel[0] = '\0';
              in_RDI->_ecLevel[1] = '\0';
              in_RDI->_ecLevel[2] = '\0';
              in_RDI->_ecLevel[3] = '\0';
              in_RDI->_version[0] = '\0';
              in_RDI->_version[1] = '\0';
              in_RDI->_version[2] = '\0';
              in_RDI->_version[3] = '\0';
              in_RDI->_lineCount = 0;
              (in_RDI->_sai).id.field_2._M_allocated_capacity = 0;
              *(undefined8 *)((long)&(in_RDI->_sai).id.field_2 + 8) = 0;
              *(undefined8 *)&(in_RDI->_sai).id = 0;
              (in_RDI->_sai).id._M_string_length = 0;
              *(undefined8 *)&(in_RDI->_readerOpts)._formats = 0;
              (in_RDI->_sai).index = 0;
              (in_RDI->_sai).count = 0;
              (in_RDI->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[3].x = 0;
              (in_RDI->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[3].y = 0;
              *(undefined8 *)&in_RDI->_readerOpts = 0;
              (in_RDI->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[1].x = 0;
              (in_RDI->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[1].y = 0;
              (in_RDI->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[2].x = 0;
              (in_RDI->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[2].y = 0;
              (in_RDI->_error)._line = 0;
              (in_RDI->_error)._type = None;
              *(undefined5 *)&(in_RDI->_error).field_0x2b = 0;
              (in_RDI->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[0].x = 0;
              (in_RDI->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[0].y = 0;
              *(undefined8 *)((long)&(in_RDI->_error)._msg.field_2 + 8) = 0;
              (in_RDI->_error)._file = (char *)0x0;
              (in_RDI->_error)._msg._M_string_length = 0;
              (in_RDI->_error)._msg.field_2._M_allocated_capacity = 0;
              (in_RDI->_content).symbology.code = '\0';
              (in_RDI->_content).symbology.modifier = '\0';
              (in_RDI->_content).symbology.eciModifierOffset = '\0';
              (in_RDI->_content).symbology.aiFlag = None;
              (in_RDI->_content).defaultCharset = Unknown;
              (in_RDI->_content).hasECI = false;
              *(undefined2 *)&(in_RDI->_content).field_0x36 = 0;
              *(undefined8 *)&(in_RDI->_error)._msg = 0;
              (in_RDI->_content).encodings.
              super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              (in_RDI->_content).encodings.
              super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              (in_RDI->_content).bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              (in_RDI->_content).encodings.
              super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              (in_RDI->_content).bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)0x0;
              (in_RDI->_content).bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)0x0;
              in_RDI->_isMirrored = false;
              in_RDI->_isInverted = false;
              in_RDI->_readerInit = false;
              *(undefined5 *)&in_RDI->field_0xd3 = 0;
              Result::Result((Result *)CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40)
                            );
              local_e8[1] = 1;
            }
          }
        }
        else if (local_e8[0] < 0x67) {
          bVar1 = Raw2TxtDecoder::decode
                            ((Raw2TxtDecoder *)
                             CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58),
                             (int)((ulong)in_stack_fffffffffffffd50 >> 0x20));
          if (bVar1) goto LAB_0028d3ea;
          in_RDI->_format = None;
          in_RDI->_ecLevel[0] = '\0';
          in_RDI->_ecLevel[1] = '\0';
          in_RDI->_ecLevel[2] = '\0';
          in_RDI->_ecLevel[3] = '\0';
          in_RDI->_version[0] = '\0';
          in_RDI->_version[1] = '\0';
          in_RDI->_version[2] = '\0';
          in_RDI->_version[3] = '\0';
          in_RDI->_lineCount = 0;
          (in_RDI->_sai).id.field_2._M_allocated_capacity = 0;
          *(undefined8 *)((long)&(in_RDI->_sai).id.field_2 + 8) = 0;
          *(undefined8 *)&(in_RDI->_sai).id = 0;
          (in_RDI->_sai).id._M_string_length = 0;
          *(undefined8 *)&(in_RDI->_readerOpts)._formats = 0;
          (in_RDI->_sai).index = 0;
          (in_RDI->_sai).count = 0;
          (in_RDI->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[3].x = 0;
          (in_RDI->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[3].y = 0;
          *(undefined8 *)&in_RDI->_readerOpts = 0;
          (in_RDI->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[1].x = 0;
          (in_RDI->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[1].y = 0;
          (in_RDI->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[2].x = 0;
          (in_RDI->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[2].y = 0;
          (in_RDI->_error)._line = 0;
          (in_RDI->_error)._type = None;
          *(undefined5 *)&(in_RDI->_error).field_0x2b = 0;
          (in_RDI->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[0].x = 0;
          (in_RDI->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[0].y = 0;
          *(undefined8 *)((long)&(in_RDI->_error)._msg.field_2 + 8) = 0;
          (in_RDI->_error)._file = (char *)0x0;
          (in_RDI->_error)._msg._M_string_length = 0;
          (in_RDI->_error)._msg.field_2._M_allocated_capacity = 0;
          (in_RDI->_content).symbology.code = '\0';
          (in_RDI->_content).symbology.modifier = '\0';
          (in_RDI->_content).symbology.eciModifierOffset = '\0';
          (in_RDI->_content).symbology.aiFlag = None;
          (in_RDI->_content).defaultCharset = Unknown;
          (in_RDI->_content).hasECI = false;
          *(undefined2 *)&(in_RDI->_content).field_0x36 = 0;
          *(undefined8 *)&(in_RDI->_error)._msg = 0;
          (in_RDI->_content).encodings.
          super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          (in_RDI->_content).encodings.
          super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          (in_RDI->_content).bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          (in_RDI->_content).encodings.
          super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          (in_RDI->_content).bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          (in_RDI->_content).bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          in_RDI->_isMirrored = false;
          in_RDI->_isInverted = false;
          in_RDI->_readerInit = false;
          *(undefined5 *)&in_RDI->field_0xd3 = 0;
          Result::Result((Result *)CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40));
          local_e8[1] = 1;
        }
        else {
          in_RDI->_format = None;
          in_RDI->_ecLevel[0] = '\0';
          in_RDI->_ecLevel[1] = '\0';
          in_RDI->_ecLevel[2] = '\0';
          in_RDI->_ecLevel[3] = '\0';
          in_RDI->_version[0] = '\0';
          in_RDI->_version[1] = '\0';
          in_RDI->_version[2] = '\0';
          in_RDI->_version[3] = '\0';
          in_RDI->_lineCount = 0;
          (in_RDI->_sai).id.field_2._M_allocated_capacity = 0;
          *(undefined8 *)((long)&(in_RDI->_sai).id.field_2 + 8) = 0;
          *(undefined8 *)&(in_RDI->_sai).id = 0;
          (in_RDI->_sai).id._M_string_length = 0;
          *(undefined8 *)&(in_RDI->_readerOpts)._formats = 0;
          (in_RDI->_sai).index = 0;
          (in_RDI->_sai).count = 0;
          (in_RDI->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[3].x = 0;
          (in_RDI->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[3].y = 0;
          *(undefined8 *)&in_RDI->_readerOpts = 0;
          (in_RDI->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[1].x = 0;
          (in_RDI->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[1].y = 0;
          (in_RDI->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[2].x = 0;
          (in_RDI->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[2].y = 0;
          (in_RDI->_error)._line = 0;
          (in_RDI->_error)._type = None;
          *(undefined5 *)&(in_RDI->_error).field_0x2b = 0;
          (in_RDI->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[0].x = 0;
          (in_RDI->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[0].y = 0;
          *(undefined8 *)((long)&(in_RDI->_error)._msg.field_2 + 8) = 0;
          (in_RDI->_error)._file = (char *)0x0;
          (in_RDI->_error)._msg._M_string_length = 0;
          (in_RDI->_error)._msg.field_2._M_allocated_capacity = 0;
          (in_RDI->_content).symbology.code = '\0';
          (in_RDI->_content).symbology.modifier = '\0';
          (in_RDI->_content).symbology.eciModifierOffset = '\0';
          (in_RDI->_content).symbology.aiFlag = None;
          (in_RDI->_content).defaultCharset = Unknown;
          (in_RDI->_content).hasECI = false;
          *(undefined2 *)&(in_RDI->_content).field_0x36 = 0;
          *(undefined8 *)&(in_RDI->_error)._msg = 0;
          (in_RDI->_content).encodings.
          super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          (in_RDI->_content).encodings.
          super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          (in_RDI->_content).bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          (in_RDI->_content).encodings.
          super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          (in_RDI->_content).bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          (in_RDI->_content).bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          in_RDI->_isMirrored = false;
          in_RDI->_isInverted = false;
          in_RDI->_readerInit = false;
          *(undefined5 *)&in_RDI->field_0xd3 = 0;
          Result::Result((Result *)CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40));
          local_e8[1] = 1;
        }
      }
      else {
        in_RDI->_format = None;
        in_RDI->_ecLevel[0] = '\0';
        in_RDI->_ecLevel[1] = '\0';
        in_RDI->_ecLevel[2] = '\0';
        in_RDI->_ecLevel[3] = '\0';
        in_RDI->_version[0] = '\0';
        in_RDI->_version[1] = '\0';
        in_RDI->_version[2] = '\0';
        in_RDI->_version[3] = '\0';
        in_RDI->_lineCount = 0;
        (in_RDI->_sai).id.field_2._M_allocated_capacity = 0;
        *(undefined8 *)((long)&(in_RDI->_sai).id.field_2 + 8) = 0;
        *(undefined8 *)&(in_RDI->_sai).id = 0;
        (in_RDI->_sai).id._M_string_length = 0;
        *(undefined8 *)&(in_RDI->_readerOpts)._formats = 0;
        (in_RDI->_sai).index = 0;
        (in_RDI->_sai).count = 0;
        (in_RDI->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[3].x = 0;
        (in_RDI->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[3].y = 0;
        *(undefined8 *)&in_RDI->_readerOpts = 0;
        (in_RDI->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[1].x = 0;
        (in_RDI->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[1].y = 0;
        (in_RDI->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[2].x = 0;
        (in_RDI->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[2].y = 0;
        (in_RDI->_error)._line = 0;
        (in_RDI->_error)._type = None;
        *(undefined5 *)&(in_RDI->_error).field_0x2b = 0;
        (in_RDI->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[0].x = 0;
        (in_RDI->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[0].y = 0;
        *(undefined8 *)((long)&(in_RDI->_error)._msg.field_2 + 8) = 0;
        (in_RDI->_error)._file = (char *)0x0;
        (in_RDI->_error)._msg._M_string_length = 0;
        (in_RDI->_error)._msg.field_2._M_allocated_capacity = 0;
        (in_RDI->_content).symbology.code = '\0';
        (in_RDI->_content).symbology.modifier = '\0';
        (in_RDI->_content).symbology.eciModifierOffset = '\0';
        (in_RDI->_content).symbology.aiFlag = None;
        (in_RDI->_content).defaultCharset = Unknown;
        (in_RDI->_content).hasECI = false;
        *(undefined2 *)&(in_RDI->_content).field_0x36 = 0;
        *(undefined8 *)&(in_RDI->_error)._msg = 0;
        (in_RDI->_content).encodings.
        super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        (in_RDI->_content).encodings.
        super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        (in_RDI->_content).bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        (in_RDI->_content).encodings.
        super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        (in_RDI->_content).bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        (in_RDI->_content).bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        in_RDI->_isMirrored = false;
        in_RDI->_isInverted = false;
        in_RDI->_readerInit = false;
        *(undefined5 *)&in_RDI->field_0xd3 = 0;
        Result::Result((Result *)CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40));
        local_e8[1] = 1;
      }
      Raw2TxtDecoder::~Raw2TxtDecoder((Raw2TxtDecoder *)0x28d903);
      ByteArray::~ByteArray((ByteArray *)0x28d910);
    }
  }
  else {
    memset(in_RDI,0,0xd8);
    Result::Result((Result *)CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40));
  }
  return in_RDI;
LAB_0028d3ea:
  local_e9 = narrow_cast<unsigned_char,int&>(local_e8);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffd00,
             (value_type_conflict *)CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
  goto LAB_0028d138;
}

Assistant:

Barcode Code128Reader::decodePattern(int rowNumber, PatternView& next, std::unique_ptr<DecodingState>&) const
{
	int minCharCount = 4; // start + payload + checksum + stop
	auto decodePattern = [](const PatternView& view, bool start = false) {
		// This is basically the reference algorithm from the specification
		int code = IndexOf(E2E_PATTERNS, ToInt(NormalizedE2EPattern<CHAR_LEN, CHAR_SUM>(view)));
		if (code == -1 && !start) // if the reference algo fails, give the original upstream version a try (required to decode a few samples)
			code = DecodeDigit(view, Code128::CODE_PATTERNS, MAX_AVG_VARIANCE, MAX_INDIVIDUAL_VARIANCE);
		return code;
	};

	next = FindLeftGuard(next, minCharCount * CHAR_LEN, START_PATTERN_PREFIX, QUIET_ZONE);
	if (!next.isValid())
		return {};

	next = next.subView(0, CHAR_LEN);
	int startCode = decodePattern(next, true);
	if (!(CODE_START_A <= startCode && startCode <= CODE_START_C))
		return {};

	int xStart = next.pixelsInFront();
	ByteArray rawCodes;
	rawCodes.reserve(20);
	rawCodes.push_back(narrow_cast<uint8_t>(startCode));

	Raw2TxtDecoder raw2txt(startCode);

	while (true) {
		if (!next.skipSymbol())
			return {};

		// Decode another code from image
		int code = decodePattern(next);
		if (code == -1)
			return {};
		if (code == CODE_STOP)
			break;
		if (code >= CODE_START_A)
			return {};
		if (!raw2txt.decode(code))
			return {};

		rawCodes.push_back(narrow_cast<uint8_t>(code));
	}

	if (Size(rawCodes) < minCharCount - 1) // stop code is missing in rawCodes
		return {};

	// check termination bar (is present and not wider than about 2 modules) and quiet zone (next is now 13 modules
	// wide, require at least 8)
	next = next.subView(0, CHAR_LEN + 1);
	if (!next.isValid() || next[CHAR_LEN] > next.sum(CHAR_LEN) / 4 || !next.hasQuietZoneAfter(QUIET_ZONE/13))
		return {};

	Error error;
	int checksum = rawCodes.front();
	for (int i = 1; i < Size(rawCodes) - 1; ++i)
		checksum += i * rawCodes[i];
	// the last code is the checksum:
	if (checksum % 103 != rawCodes.back())
		error = ChecksumError();

	int xStop = next.pixelsTillEnd();
	return Barcode(raw2txt.text(), rowNumber, xStart, xStop, BarcodeFormat::Code128, raw2txt.symbologyIdentifier(), error,
				   raw2txt.readerInit());
}